

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

CTextureHandle __thiscall
CGraphics_Threaded::LoadTextureRaw
          (CGraphics_Threaded *this,int Width,int Height,int Format,void *pData,int StoreFormat,
          int Flags)

{
  uint uVar1;
  long lVar2;
  int in_ECX;
  CCommandBuffer *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  void *pTmpData;
  int MemSize;
  int Tex;
  CTextureCreateCommand Cmd;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI[3].m_CmdBuffer.m_pData + 0x1268) == 0) {
    uVar1 = in_RDI[0x615e].m_CmdBuffer.m_Used;
    in_RDI[0x615e].m_CmdBuffer.m_Used =
         *(uint *)((long)&in_RDI[0x6008].m_pCmdBufferTail + (long)(int)uVar1 * 4 + 4);
    *(undefined4 *)((long)&in_RDI[0x6008].m_pCmdBufferTail + (long)(int)uVar1 * 4 + 4) = 0xffffffff;
    CCommandBuffer::CTextureCreateCommand::CTextureCreateCommand((CTextureCreateCommand *)0x12ed3a);
    CImageInfo::GetPixelSize(in_ECX);
    ImageFormatToTexFormat(in_ECX);
    ImageFormatToTexFormat(in_R9D);
    mem_alloc(0);
    mem_copy((void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
    CCommandBuffer::AddCommand<CCommandBuffer::CTextureCreateCommand>
              (in_RDI,(CTextureCreateCommand *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_c = (int)IGraphics::CreateTextureHandle
                             ((IGraphics *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
  }
  else {
    local_c = *(int *)((long)&in_RDI[0x6008].m_pCmdBufferHead + 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (CTextureHandle)local_c;
  }
  __stack_chk_fail();
}

Assistant:

IGraphics::CTextureHandle CGraphics_Threaded::LoadTextureRaw(int Width, int Height, int Format, const void *pData, int StoreFormat, int Flags)
{
	// don't waste memory on texture if we are stress testing
	if(m_pConfig->m_DbgStress)
		return m_InvalidTexture;

	// grab texture
	int Tex = m_FirstFreeTexture;
	m_FirstFreeTexture = m_aTextureIndices[Tex];
	m_aTextureIndices[Tex] = -1;

	CCommandBuffer::CTextureCreateCommand Cmd;
	Cmd.m_Slot = Tex;
	Cmd.m_Width = Width;
	Cmd.m_Height = Height;
	Cmd.m_PixelSize = CImageInfo::GetPixelSize(Format);
	Cmd.m_Format = ImageFormatToTexFormat(Format);
	Cmd.m_StoreFormat = ImageFormatToTexFormat(StoreFormat);


	// flags
	Cmd.m_Flags = CCommandBuffer::TEXFLAG_TEXTURE2D;
	if(Flags&IGraphics::TEXLOAD_NOMIPMAPS)
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_NOMIPMAPS;
	if(m_pConfig->m_GfxTextureCompression)
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_COMPRESSED;
	if(m_pConfig->m_GfxTextureQuality || Flags&TEXLOAD_NORESAMPLE)
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_QUALITY;
	if(Flags&IGraphics::TEXLOAD_ARRAY_256)
	{
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_TEXTURE3D;
		Cmd.m_Flags &= ~CCommandBuffer::TEXFLAG_TEXTURE2D;
	}
	if(Flags&IGraphics::TEXLOAD_MULTI_DIMENSION)
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_TEXTURE3D;
	if(Flags&IGraphics::TEXLOAD_LINEARMIPMAPS)
		Cmd.m_Flags |= CCommandBuffer::TEXTFLAG_LINEARMIPMAPS;


	// copy texture data
	int MemSize = Width*Height*Cmd.m_PixelSize;
	void *pTmpData = mem_alloc(MemSize);
	mem_copy(pTmpData, pData, MemSize);
	Cmd.m_pData = pTmpData;


	//
	m_pCommandBuffer->AddCommand(Cmd);

	return CreateTextureHandle(Tex);
}